

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> * __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Reserve
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType newCapacity,
          CrtAllocator *allocator)

{
  void *pvVar1;
  
  if ((this->data_).f.flags == 4) {
    if ((this->data_).s.hashcode < newCapacity) {
      pvVar1 = realloc((void *)((ulong)(this->data_).s.str & 0xffffffffffff),(ulong)newCapacity << 4
                      );
      (this->data_).s.str = (Ch *)((ulong)(this->data_).f.flags << 0x30 | (ulong)pvVar1);
      (this->data_).s.hashcode = newCapacity;
    }
    return this;
  }
  __assert_fail("IsArray()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x69f,
                "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::Reserve(SizeType, Allocator &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

bool IsArray()  const { return data_.f.flags == kArrayFlag; }